

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O3

double sampleClimatePara(BiomeNoise *bn,int64_t *np,double x,double z)

{
  float fVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  float fVar5;
  float np_param [4];
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  
  if ((long)bn->nptype == 4) {
    dVar2 = sampleDoublePerlin(bn->climate + 2,x,0.0,z);
    dVar3 = sampleDoublePerlin(bn->climate + 3,x,0.0,z);
    dVar4 = sampleDoublePerlin(bn->climate + 5,x,0.0,z);
    fVar5 = (float)dVar4;
    local_20 = (ABS(ABS(fVar5) + -0.6666667) + -0.33333334) * -3.0;
    local_28 = (float)dVar2;
    local_24 = (float)dVar3;
    local_1c = fVar5;
    fVar1 = getSpline(bn->sp,&local_28);
    fVar1 = fVar1 + 0.015 + 0.48125;
    if (np != (int64_t *)0x0) {
      np[2] = (long)((float)dVar2 * 10000.0);
      np[3] = (long)((float)dVar3 * 10000.0);
      np[4] = (long)(fVar1 * 10000.0);
      np[5] = (long)(fVar5 * 10000.0);
    }
    dVar2 = (double)fVar1;
  }
  else {
    dVar2 = sampleDoublePerlin(bn->climate + bn->nptype,x,0.0,z);
    if (np != (int64_t *)0x0) {
      np[bn->nptype] = (long)(dVar2 * 10000.0);
    }
  }
  return dVar2;
}

Assistant:

double sampleClimatePara(const BiomeNoise *bn, int64_t *np, double x, double z)
{
    if (bn->nptype == NP_DEPTH)
    {
        float c, e, w;
        c = sampleDoublePerlin(bn->climate + NP_CONTINENTALNESS, x, 0, z);
        e = sampleDoublePerlin(bn->climate + NP_EROSION, x, 0, z);
        w = sampleDoublePerlin(bn->climate + NP_WEIRDNESS, x, 0, z);

        float np_param[] = {
            c, e, -3.0F * ( fabsf( fabsf(w) - 0.6666667F ) - 0.33333334F ), w,
        };
        double off = getSpline(bn->sp, np_param) + 0.015F;
        int y = 0;
        float d = 1.0 - (y * 4) / 128.0 - 83.0/160.0 + off;
        if (np)
        {
            np[2] = (int64_t)(10000.0F*c);
            np[3] = (int64_t)(10000.0F*e);
            np[4] = (int64_t)(10000.0F*d);
            np[5] = (int64_t)(10000.0F*w);
        }
        return d;
    }
    double p = sampleDoublePerlin(bn->climate + bn->nptype, x, 0, z);
    if (np)
        np[bn->nptype] = (int64_t)(10000.0F*p);
    return p;
}